

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-bit-map-type.cpp
# Opt level: O0

Up __thiscall yactfr::FixedLengthBitMapType::_clone(FixedLengthBitMapType *this)

{
  FixedLengthBitArrayType *in_RSI;
  undefined1 local_38 [12];
  undefined1 local_2c [28];
  FixedLengthBitMapType *this_local;
  
  this_local = this;
  local_2c._8_4_ = DataType::alignment((DataType *)in_RSI);
  local_2c._4_4_ = FixedLengthBitArrayType::length(in_RSI);
  local_2c._0_4_ = FixedLengthBitArrayType::byteOrder(in_RSI);
  local_38._8_4_ = FixedLengthBitArrayType::bitOrder(in_RSI);
  DataType::attributes((DataType *)in_RSI);
  internal::tryCloneAttrs((MapItem *)local_38);
  create<unsigned_int,unsigned_int,yactfr::ByteOrder,std::map<std::__cxx11::string,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::IntegerRangeSet<unsigned_long_long,true>>>>const&,yactfr::BitOrder,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((uint *)(local_2c + 0xc),(uint *)(local_2c + 8),(ByteOrder *)(local_2c + 4),
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
              *)local_2c,(BitOrder *)(in_RSI + 1),
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             (local_38 + 8));
  std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>::
  unique_ptr<yactfr::FixedLengthBitMapType_const,std::default_delete<yactfr::FixedLengthBitMapType_const>,void>
            ((unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>> *)this,
             (unique_ptr<const_yactfr::FixedLengthBitMapType,_std::default_delete<const_yactfr::FixedLengthBitMapType>_>
              *)(local_2c + 0xc));
  std::
  unique_ptr<const_yactfr::FixedLengthBitMapType,_std::default_delete<const_yactfr::FixedLengthBitMapType>_>
  ::~unique_ptr((unique_ptr<const_yactfr::FixedLengthBitMapType,_std::default_delete<const_yactfr::FixedLengthBitMapType>_>
                 *)(local_2c + 0xc));
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_38);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up FixedLengthBitMapType::_clone() const
{
    return FixedLengthBitMapType::create(this->alignment(), this->length(), this->byteOrder(),
                                         _flags, this->bitOrder(),
                                         internal::tryCloneAttrs(this->attributes()));
}